

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VCFilterFile>::Inserter::insertOne
          (Inserter *this,qsizetype pos,VCFilterFile *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  VCFilterFile *pVVar3;
  qsizetype qVar4;
  VCFilterFile *pVVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pVVar3 = this->begin;
  lVar11 = this->size;
  pVVar5 = pVVar3 + lVar11;
  this->end = pVVar5;
  this->last = pVVar3 + lVar11 + -1;
  lVar11 = lVar11 - pos;
  this->where = pVVar3 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (0 < lVar11) {
    pVVar5->excludeFromBuild = pVVar5[-1].excludeFromBuild;
    pDVar7 = pVVar5[-1].file.d.d;
    pcVar8 = pVVar5[-1].file.d.ptr;
    pVVar5[-1].file.d.d = (Data *)0x0;
    pVVar5[-1].file.d.ptr = (char16_t *)0x0;
    (pVVar5->file).d.d = pDVar7;
    (pVVar5->file).d.ptr = pcVar8;
    qVar4 = pVVar5[-1].file.d.size;
    pVVar5[-1].file.d.size = 0;
    (pVVar5->file).d.size = qVar4;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pVVar5 = this->last;
        (&pVVar5->excludeFromBuild)[lVar11] = (&pVVar5[-1].excludeFromBuild)[lVar11];
        puVar1 = (undefined8 *)((long)&(pVVar5->file).d.d + lVar11);
        uVar6 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)pVVar5 + lVar11 + -0x18);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pVVar5->file).d.d + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)pVVar5 + lVar11 + -0x18);
        *puVar1 = uVar6;
        puVar1[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pVVar5->file).d.size + lVar11);
        *(undefined8 *)((long)&(pVVar5->file).d.size + lVar11) =
             *(undefined8 *)((long)pVVar5 + lVar11 + -8);
        *(undefined8 *)((long)pVVar5 + lVar11 + -8) = uVar6;
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x20;
      } while (lVar12 != this->move);
    }
    pVVar5 = this->where;
    pVVar5->excludeFromBuild = t->excludeFromBuild;
    pDVar7 = (pVVar5->file).d.d;
    (pVVar5->file).d.d = (t->file).d.d;
    (t->file).d.d = pDVar7;
    pcVar8 = (pVVar5->file).d.ptr;
    (pVVar5->file).d.ptr = (t->file).d.ptr;
    (t->file).d.ptr = pcVar8;
    qVar4 = (pVVar5->file).d.size;
    (pVVar5->file).d.size = (t->file).d.size;
    (t->file).d.size = qVar4;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar11;
  this->move = 0;
  this->sourceCopyAssign = lVar11;
  pVVar5->excludeFromBuild = t->excludeFromBuild;
  pDVar7 = (t->file).d.d;
  (t->file).d.d = (Data *)0x0;
  (pVVar5->file).d.d = pDVar7;
  pcVar8 = (t->file).d.ptr;
  (t->file).d.ptr = (char16_t *)0x0;
  (pVVar5->file).d.ptr = pcVar8;
  qVar4 = (t->file).d.size;
  (t->file).d.size = 0;
  (pVVar5->file).d.size = qVar4;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }